

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Gla(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pAig;
  bool bVar1;
  Abc_Frame_t *pAbc_00;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  Abs_Par_t Pars;
  Abs_Par_t local_c0;
  Abc_Frame_t *local_38;
  
  local_38 = pAbc;
  Abs_ParSetDefaults(&local_c0);
  Extra_UtilGetoptReset();
  bVar1 = true;
LAB_00232331:
  iVar2 = Extra_UtilGetopt(argc,argv,"FSCLDETRQPBAtfardmnscbpquwvh");
  pAbc_00 = local_38;
  iVar4 = globalUtilOptind;
  switch(iVar2) {
  case 0x41:
    if (globalUtilOptind < argc) {
      local_c0.pFileVabs = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_00232331;
    }
    pcVar6 = "Command line switch \"-A\" should be followed by a file name.\n";
    break;
  case 0x42:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_c0.nFramesNoChangeLim = uVar3;
      goto LAB_0023256d;
    }
    pcVar6 = "Command line switch \"-B\" should be followed by an integer.\n";
    break;
  case 0x43:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_c0.nConfLimit = uVar3;
      goto LAB_0023256d;
    }
    pcVar6 = "Command line switch \"-C\" should be followed by an integer.\n";
    break;
  case 0x44:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_c0.nLearnedDelta = uVar3;
      goto LAB_0023256d;
    }
    pcVar6 = "Command line switch \"-D\" should be followed by an integer.\n";
    break;
  case 0x45:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_c0.nLearnedPerce = uVar3;
      goto LAB_0023256d;
    }
LAB_0023259f:
    pcVar6 = "Command line switch \"-P\" should be followed by an integer.\n";
    break;
  case 0x46:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_c0.nFramesMax = uVar3;
      goto LAB_0023256d;
    }
    pcVar6 = "Command line switch \"-F\" should be followed by an integer.\n";
    break;
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6f:
    goto switchD_00232352_caseD_47;
  case 0x4c:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_c0.nLearnedStart = uVar3;
      goto LAB_0023256d;
    }
    pcVar6 = "Command line switch \"-L\" should be followed by an integer.\n";
    break;
  case 0x50:
    if (argc <= globalUtilOptind) goto LAB_0023259f;
    uVar3 = atoi(argv[globalUtilOptind]);
    local_c0.nRatioMax = uVar3;
LAB_0023256d:
    globalUtilOptind = iVar4 + 1;
    if ((int)uVar3 < 0) {
switchD_00232352_caseD_47:
      Abc_Print(-2,"usage: &gla [-FSCLDETRQPB num] [-A file] [-fardmnscbpquwvh]\n");
      Abc_Print(-2,"\t          fixed-time-frame gate-level proof- and cex-based abstraction\n");
      Abc_Print(-2,"\t-F num  : the max number of timeframes to unroll [default = %d]\n",
                (ulong)(uint)local_c0.nFramesMax);
      Abc_Print(-2,"\t-S num  : the starting time frame (0=unused) [default = %d]\n",
                (ulong)(uint)local_c0.nFramesStart);
      Abc_Print(-2,"\t-C num  : the max number of SAT solver conflicts (0=unused) [default = %d]\n",
                (ulong)(uint)local_c0.nConfLimit);
      Abc_Print(-2,
                "\t-L num  : the max number of learned clauses to keep (0=unused) [default = %d]\n",
                (ulong)(uint)local_c0.nLearnedStart);
      Abc_Print(-2,"\t-D num  : delta value for learned clause removal [default = %d]\n",
                (ulong)(uint)local_c0.nLearnedDelta);
      Abc_Print(-2,"\t-E num  : ratio percentage for learned clause removal [default = %d]\n",
                (ulong)(uint)local_c0.nLearnedPerce);
      Abc_Print(-2,"\t-T num  : an approximate timeout, in seconds [default = %d]\n",
                (ulong)(uint)local_c0.nTimeOut);
      Abc_Print(-2,
                "\t-R num  : stop when abstraction size exceeds num %% (0<=num<=100) [default = %d]\n"
                ,(ulong)(uint)local_c0.nRatioMin);
      Abc_Print(-2,
                "\t-Q num  : stop when abstraction size exceeds num %% during refinement (0<=num<=100) [default = %d]\n"
                ,(ulong)(uint)local_c0.nRatioMin2);
      Abc_Print(-2,
                "\t-P num  : maximum percentage of added objects before a restart (0<=num<=100) [default = %d]\n"
                ,(ulong)(uint)local_c0.nRatioMax);
      Abc_Print(-2,
                "\t-B num  : the number of stable frames to call prover or dump abstraction [default = %d]\n"
                ,(ulong)(uint)local_c0.nFramesNoChangeLim);
      Abc_Print(-2,"\t-A file : file name for dumping abstrated model [default = \"glabs.aig\"]\n");
      pcVar5 = "yes";
      pcVar6 = "yes";
      if (local_c0.fPropFanout == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-f      : toggle propagating fanout implications [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_c0.fAddLayer == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-a      : toggle refinement by adding one layers of gates [default = %s]\n",
                pcVar6);
      pcVar6 = "yes";
      if (local_c0.fNewRefine == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-r      : toggle using improved refinement heuristics [default = %s]\n",pcVar6
               );
      pcVar6 = "yes";
      if (local_c0.fDumpVabs == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-d      : toggle dumping abstracted model into a file [default = %s]\n",pcVar6
               );
      pcVar6 = "yes";
      if (local_c0.fDumpMabs == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-m      : toggle dumping abstraction map into a file [default = %s]\n",pcVar6)
      ;
      pcVar6 = "yes";
      if (!bVar1) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-n      : toggle using new algorithms [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_c0.fUseSkip == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-s      : toggle skipping previously proved timeframes [default = %s]\n",
                pcVar6);
      pcVar6 = "yes";
      if (local_c0.fUseSimple == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-c      : toggle using naive (2-input AND node) CNF encoding [default = %s]\n"
                ,pcVar6);
      pcVar6 = "yes";
      if (local_c0.fSkipHash == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-b      : toggle CNF construction without hashing [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_c0.fUseFullProof == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-p      : toggle using full-proof for UNSAT cores [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_c0.fCallProver == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-q      : toggle calling the prover [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_c0.fSimpProver == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,
                "\t-u      : toggle enabling simplifation before calling the prover [default = %s]\n"
                ,pcVar6);
      pcVar6 = "yes";
      if (local_c0.fVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar6);
      if (local_c0.fVeryVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-w      : toggle printing more verbose information [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h      : print the command usage\n");
      return 1;
    }
    goto LAB_00232331;
  case 0x51:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_c0.nRatioMin2 = uVar3;
      goto LAB_0023256d;
    }
    pcVar6 = "Command line switch \"-Q\" should be followed by an integer.\n";
    break;
  case 0x52:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_c0.nRatioMin = uVar3;
      goto LAB_0023256d;
    }
    pcVar6 = "Command line switch \"-R\" should be followed by an integer.\n";
    break;
  case 0x53:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_c0.nFramesStart = uVar3;
      goto LAB_0023256d;
    }
    pcVar6 = "Command line switch \"-S\" should be followed by an integer.\n";
    break;
  case 0x54:
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_c0.nTimeOut = uVar3;
      goto LAB_0023256d;
    }
    pcVar6 = "Command line switch \"-T\" should be followed by an integer.\n";
    break;
  case 0x61:
    local_c0.fAddLayer = local_c0.fAddLayer ^ 1;
    goto LAB_00232331;
  case 0x62:
    local_c0.fSkipHash = local_c0.fSkipHash ^ 1;
    goto LAB_00232331;
  case 99:
    local_c0.fUseSimple = local_c0.fUseSimple ^ 1;
    goto LAB_00232331;
  case 100:
    local_c0.fDumpVabs = local_c0.fDumpVabs ^ 1;
    goto LAB_00232331;
  case 0x66:
    local_c0.fPropFanout = local_c0.fPropFanout ^ 1;
    goto LAB_00232331;
  case 0x6d:
    local_c0.fDumpMabs = local_c0.fDumpMabs ^ 1;
    goto LAB_00232331;
  case 0x6e:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_00232331;
  case 0x70:
    local_c0.fUseFullProof = local_c0.fUseFullProof ^ 1;
    goto LAB_00232331;
  case 0x71:
    local_c0.fCallProver = local_c0.fCallProver ^ 1;
    goto LAB_00232331;
  case 0x72:
    local_c0.fNewRefine = local_c0.fNewRefine ^ 1;
    goto LAB_00232331;
  case 0x73:
    local_c0.fUseSkip = local_c0.fUseSkip ^ 1;
    goto LAB_00232331;
  case 0x74:
    local_c0.fUseTermVars._0_1_ = (byte)local_c0.fUseTermVars ^ 1;
    goto LAB_00232331;
  case 0x75:
    local_c0.fSimpProver = local_c0.fSimpProver ^ 1;
    goto LAB_00232331;
  case 0x76:
    local_c0.fVerbose = local_c0.fVerbose ^ 1;
    goto LAB_00232331;
  case 0x77:
    local_c0.fVeryVerbose = local_c0.fVeryVerbose ^ 1;
    goto LAB_00232331;
  default:
    if (iVar2 == -1) {
      pAig = local_38->pGia;
      if (pAig == (Gia_Man_t *)0x0) {
        pcVar6 = "There is no AIG.\n";
        iVar4 = -1;
      }
      else {
        if (pAig->vCos->nSize - pAig->nRegs < 2) {
          if (local_c0.nFramesMax < 0) {
            pcVar6 = "The number of starting frames should be a positive integer.\n";
          }
          else {
            if ((local_c0.nFramesMax == 0) || (local_c0.nFramesStart <= local_c0.nFramesMax)) {
              if (bVar1) {
                iVar4 = Gia_ManPerformGla(pAig,&local_c0);
              }
              else {
                iVar4 = Gia_ManPerformGlaOld(pAig,&local_c0,0);
              }
              pAbc_00->Status = iVar4;
              pAbc_00->nFrames = local_c0.iFrame;
              Abc_FrameReplaceCex(pAbc_00,&pAbc_00->pGia->pCexSeq);
              return 0;
            }
            pcVar6 = "The starting frame is larger than the max number of frames.\n";
          }
        }
        else {
          pcVar6 = "The network is more than one PO (run \"orpos\").\n";
        }
        iVar4 = 1;
      }
      Abc_Print(iVar4,pcVar6);
      return 0;
    }
    goto switchD_00232352_caseD_47;
  }
  Abc_Print(-1,pcVar6);
  goto switchD_00232352_caseD_47;
}

Assistant:

int Abc_CommandAbc9Gla( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abs_Par_t Pars, * pPars = &Pars;
    int c, fNewAlgo = 1;
    Abs_ParSetDefaults( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FSCLDETRQPBAtfardmnscbpquwvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesMax < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesStart < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nConfLimit < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedStart < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedDelta = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedDelta < 0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedPerce = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedPerce < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRatioMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRatioMin < 0 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRatioMin2 = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRatioMin2 < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRatioMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRatioMax < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesNoChangeLim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesNoChangeLim < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a file name.\n" );
                goto usage;
            }
            pPars->pFileVabs = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 't':
            pPars->fUseTermVars ^= 1;
            break;
        case 'f':
            pPars->fPropFanout ^= 1;
            break;
        case 'a':
            pPars->fAddLayer ^= 1;
            break;
        case 'r':
            pPars->fNewRefine ^= 1;
            break;
        case 'd':
            pPars->fDumpVabs ^= 1;
            break;
        case 'm':
            pPars->fDumpMabs ^= 1;
            break;
        case 'n':
            fNewAlgo ^= 1;
            break;
        case 's':
            pPars->fUseSkip ^= 1;
            break;
        case 'c':
            pPars->fUseSimple ^= 1;
            break;
        case 'b':
            pPars->fSkipHash ^= 1;
            break;
        case 'p':
            pPars->fUseFullProof ^= 1;
            break;
        case 'q':
            pPars->fCallProver ^= 1;
            break;
        case 'u':
            pPars->fSimpProver ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "There is no AIG.\n" );
        return 0;
    }
/*
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
*/
    if ( Gia_ManPoNum(pAbc->pGia) > 1 )
    {
        Abc_Print( 1, "The network is more than one PO (run \"orpos\").\n" );
        return 0;
    }
    if ( pPars->nFramesMax < 0 )
    {
        Abc_Print( 1, "The number of starting frames should be a positive integer.\n" );
        return 0;
    }
    if ( pPars->nFramesMax && pPars->nFramesStart > pPars->nFramesMax )
    {
        Abc_Print( 1, "The starting frame is larger than the max number of frames.\n" );
        return 0;
    }
    if ( fNewAlgo )
        pAbc->Status = Gia_ManPerformGla( pAbc->pGia, pPars );
    else
        pAbc->Status  = Gia_ManPerformGlaOld( pAbc->pGia, pPars, 0 );
    pAbc->nFrames = pPars->iFrame;
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    return 0;

usage:
    Abc_Print( -2, "usage: &gla [-FSCLDETRQPB num] [-A file] [-fardmnscbpquwvh]\n" );
    Abc_Print( -2, "\t          fixed-time-frame gate-level proof- and cex-based abstraction\n" );
    Abc_Print( -2, "\t-F num  : the max number of timeframes to unroll [default = %d]\n", pPars->nFramesMax );
    Abc_Print( -2, "\t-S num  : the starting time frame (0=unused) [default = %d]\n", pPars->nFramesStart );
    Abc_Print( -2, "\t-C num  : the max number of SAT solver conflicts (0=unused) [default = %d]\n", pPars->nConfLimit );
    Abc_Print( -2, "\t-L num  : the max number of learned clauses to keep (0=unused) [default = %d]\n", pPars->nLearnedStart );
    Abc_Print( -2, "\t-D num  : delta value for learned clause removal [default = %d]\n", pPars->nLearnedDelta );
    Abc_Print( -2, "\t-E num  : ratio percentage for learned clause removal [default = %d]\n", pPars->nLearnedPerce );
    Abc_Print( -2, "\t-T num  : an approximate timeout, in seconds [default = %d]\n", pPars->nTimeOut );
    Abc_Print( -2, "\t-R num  : stop when abstraction size exceeds num %% (0<=num<=100) [default = %d]\n", pPars->nRatioMin );
    Abc_Print( -2, "\t-Q num  : stop when abstraction size exceeds num %% during refinement (0<=num<=100) [default = %d]\n", pPars->nRatioMin2 );
    Abc_Print( -2, "\t-P num  : maximum percentage of added objects before a restart (0<=num<=100) [default = %d]\n", pPars->nRatioMax );
    Abc_Print( -2, "\t-B num  : the number of stable frames to call prover or dump abstraction [default = %d]\n", pPars->nFramesNoChangeLim );
    Abc_Print( -2, "\t-A file : file name for dumping abstrated model [default = \"glabs.aig\"]\n" );
    Abc_Print( -2, "\t-f      : toggle propagating fanout implications [default = %s]\n", pPars->fPropFanout? "yes": "no" );
    Abc_Print( -2, "\t-a      : toggle refinement by adding one layers of gates [default = %s]\n", pPars->fAddLayer? "yes": "no" );
    Abc_Print( -2, "\t-r      : toggle using improved refinement heuristics [default = %s]\n", pPars->fNewRefine? "yes": "no" );
    Abc_Print( -2, "\t-d      : toggle dumping abstracted model into a file [default = %s]\n", pPars->fDumpVabs? "yes": "no" );
    Abc_Print( -2, "\t-m      : toggle dumping abstraction map into a file [default = %s]\n", pPars->fDumpMabs? "yes": "no" );
    Abc_Print( -2, "\t-n      : toggle using new algorithms [default = %s]\n", fNewAlgo? "yes": "no" );
    Abc_Print( -2, "\t-s      : toggle skipping previously proved timeframes [default = %s]\n", pPars->fUseSkip? "yes": "no" );
    Abc_Print( -2, "\t-c      : toggle using naive (2-input AND node) CNF encoding [default = %s]\n", pPars->fUseSimple? "yes": "no" );
    Abc_Print( -2, "\t-b      : toggle CNF construction without hashing [default = %s]\n", pPars->fSkipHash? "yes": "no" );
    Abc_Print( -2, "\t-p      : toggle using full-proof for UNSAT cores [default = %s]\n", pPars->fUseFullProof? "yes": "no" );
    Abc_Print( -2, "\t-q      : toggle calling the prover [default = %s]\n", pPars->fCallProver? "yes": "no" );
    Abc_Print( -2, "\t-u      : toggle enabling simplifation before calling the prover [default = %s]\n", pPars->fSimpProver? "yes": "no" );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w      : toggle printing more verbose information [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}